

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansv.hpp
# Opt level: O3

void ansv<unsigned_long,2,2,1>
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *in,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *left_nsv,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *right_nsv,
               vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               *lr_mins,comm *comm,size_t nonsv)

{
  long lVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  ulong uVar5;
  pointer puVar6;
  unsigned_long *puVar7;
  comm *pcVar8;
  _Elt_pointer ppVar9;
  _Elt_pointer ppVar10;
  _Elt_pointer ppVar11;
  comm *comm_00;
  unsigned_long uVar12;
  pair<unsigned_long,_unsigned_long> *ppVar13;
  pair<unsigned_long,_unsigned_long> *ppVar14;
  _Elt_pointer ppVar15;
  pair<unsigned_long,_unsigned_long> *ppVar16;
  pair<unsigned_long,_unsigned_long> *ppVar17;
  long *plVar18;
  _Elt_pointer ppVar19;
  _Map_pointer pppVar20;
  pair<unsigned_long,_unsigned_long> *ppVar21;
  _Map_pointer pppVar22;
  _Map_pointer pppVar23;
  int iVar24;
  pair<unsigned_long,_unsigned_long> *ppVar25;
  ulong uVar26;
  unsigned_long uVar27;
  ulong uVar28;
  long lVar29;
  ulong uVar30;
  ulong uVar31;
  unsigned_long uVar32;
  ulong uVar33;
  ulong *puVar34;
  _Map_pointer pppVar35;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar36;
  pointer puVar37;
  pair<unsigned_long,_unsigned_long> *ppVar38;
  long lVar39;
  ulong uVar40;
  ulong uVar41;
  size_type sVar42;
  bool bVar43;
  size_t local_size;
  vector<unsigned_long,_std::allocator<unsigned_long>_> allmins;
  unsigned_long local_min;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  recved;
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_counts;
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_displs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> send_displs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> send_counts;
  _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  local_218;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_1c8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_1c0;
  pair<unsigned_long,_unsigned_long> *local_1b8;
  pair<unsigned_long,_unsigned_long> *ppStack_1b0;
  vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  *local_1a0;
  pair<unsigned_long,_unsigned_long> *local_198;
  pair<unsigned_long,_unsigned_long> *ppStack_190;
  comm *local_188;
  pair<unsigned_long,_unsigned_long> *ppStack_180;
  size_type local_170;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_168;
  _Map_pointer local_150;
  unsigned_long local_140;
  pair<unsigned_long,_unsigned_long> local_138;
  size_type local_128;
  ulong local_120;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  local_118;
  size_t local_100;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_f8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_e0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_c8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_b0;
  _Map_pointer local_98;
  ulong local_90;
  long local_88;
  long local_80;
  reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
  local_78;
  reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
  local_58;
  
  local_218._M_impl.super__Deque_impl_data._M_finish._M_last =
       (pair<unsigned_long,_unsigned_long> *)0x0;
  local_218._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_218._M_impl.super__Deque_impl_data._M_finish._M_cur =
       (pair<unsigned_long,_unsigned_long> *)0x0;
  local_218._M_impl.super__Deque_impl_data._M_finish._M_first =
       (pair<unsigned_long,_unsigned_long> *)0x0;
  local_218._M_impl.super__Deque_impl_data._M_start._M_last =
       (pair<unsigned_long,_unsigned_long> *)0x0;
  local_218._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_218._M_impl.super__Deque_impl_data._M_start._M_cur =
       (pair<unsigned_long,_unsigned_long> *)0x0;
  local_218._M_impl.super__Deque_impl_data._M_start._M_first =
       (pair<unsigned_long,_unsigned_long> *)0x0;
  local_218._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_218._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_1c8 = right_nsv;
  local_1b8 = (pair<unsigned_long,_unsigned_long> *)left_nsv;
  local_1a0 = (vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
               *)lr_mins;
  local_100 = nonsv;
  std::
  _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::_M_initialize_map(&local_218,0);
  local_170 = (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                    super__Vector_impl_data._M_start >> 3;
  local_188 = comm;
  uVar12 = mxx::exscan<unsigned_long,std::plus<unsigned_long>>(&local_170,comm);
  lVar39 = (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_start;
  if (lVar39 != 0) {
    lVar39 = lVar39 >> 3;
    ppVar17 = local_218._M_impl.super__Deque_impl_data._M_finish._M_cur;
    ppVar15 = local_218._M_impl.super__Deque_impl_data._M_start._M_cur;
    ppVar16 = local_218._M_impl.super__Deque_impl_data._M_finish._M_first;
LAB_00142208:
    do {
      pppVar20 = local_218._M_impl.super__Deque_impl_data._M_finish._M_node;
      if (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur != ppVar15) {
        uVar31 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_start[lVar39 + -1];
        ppVar17 = ppVar15;
        if (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar16) {
          if (uVar31 < local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].first) {
            operator_delete(ppVar16);
            ppVar16 = local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            local_218._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar16 + 0x20;
            local_218._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar16 + 0x1f;
            ppVar17 = local_218._M_impl.super__Deque_impl_data._M_start._M_cur;
            ppVar15 = local_218._M_impl.super__Deque_impl_data._M_start._M_cur;
            local_218._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar16;
            local_218._M_impl.super__Deque_impl_data._M_finish._M_node =
                 local_218._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
            goto LAB_00142208;
          }
        }
        else if (uVar31 < local_218._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].first) {
          local_218._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_218._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          goto LAB_00142208;
        }
      }
      while( true ) {
        uVar31 = (long)local_218._M_impl.super__Deque_impl_data._M_finish._M_cur - (long)ppVar16 >>
                 4;
        puVar37 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        if (((long)local_218._M_impl.super__Deque_impl_data._M_start._M_last - (long)ppVar17 >> 4) +
            uVar31 + ((((ulong)((long)pppVar20 -
                               (long)local_218._M_impl.super__Deque_impl_data._M_start._M_node) >> 3
                       ) - 1) + (ulong)(pppVar20 == (_Map_pointer)0x0)) * 0x20 < 2) break;
        ppVar15 = local_218._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar16) {
          ppVar15 = pppVar20[-1] + 0x20;
        }
        uVar32 = puVar37[lVar39 + -1];
        if (uVar32 != ppVar15[-1].first) break;
        uVar40 = uVar31 - 1;
        if ((long)uVar31 < 1) {
          uVar31 = (long)uVar40 >> 5;
LAB_0014230a:
          pppVar22 = pppVar20 + uVar31;
          ppVar13 = *pppVar22;
          ppVar14 = ppVar13 + uVar40 + uVar31 * -0x20;
        }
        else {
          if (0x20 < uVar31) {
            uVar31 = uVar40 >> 5;
            goto LAB_0014230a;
          }
          ppVar14 = local_218._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          pppVar22 = pppVar20;
          ppVar13 = ppVar16;
        }
        if (ppVar14 == ppVar13) {
          ppVar14 = pppVar22[-1] + 0x20;
        }
        if (uVar32 != ppVar14[-1].first) break;
        if (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar16) {
          operator_delete(ppVar16);
          pppVar20 = local_218._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
          ppVar16 = local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
          local_218._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar16 + 0x20;
          local_218._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar16 + 0x1f;
          ppVar17 = local_218._M_impl.super__Deque_impl_data._M_start._M_cur;
          local_218._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar16;
          local_218._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar20;
        }
        else {
          local_218._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_218._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
        }
      }
      local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)((uVar12 - 1) + lVar39);
      local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)puVar37[lVar39 + -1];
      if (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_218._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::_M_push_back_aux<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&local_218,(pair<unsigned_long,_unsigned_long> *)&local_168);
      }
      else {
        (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur)->first =
             (unsigned_long)
             local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
        (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur)->second =
             (unsigned_long)
             local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_218._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_218._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      lVar39 = lVar39 + -1;
      ppVar17 = local_218._M_impl.super__Deque_impl_data._M_finish._M_cur;
      ppVar15 = local_218._M_impl.super__Deque_impl_data._M_start._M_cur;
      ppVar16 = local_218._M_impl.super__Deque_impl_data._M_finish._M_first;
    } while (lVar39 != 0);
  }
  local_58.current._M_cur = local_218._M_impl.super__Deque_impl_data._M_finish._M_cur;
  local_58.current._M_first = local_218._M_impl.super__Deque_impl_data._M_finish._M_first;
  local_58.current._M_last = local_218._M_impl.super__Deque_impl_data._M_finish._M_last;
  local_58.current._M_node = local_218._M_impl.super__Deque_impl_data._M_finish._M_node;
  local_78.current._M_cur = local_218._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_78.current._M_first = local_218._M_impl.super__Deque_impl_data._M_start._M_first;
  local_78.current._M_last = local_218._M_impl.super__Deque_impl_data._M_start._M_last;
  local_78.current._M_node = local_218._M_impl.super__Deque_impl_data._M_start._M_node;
  std::
  vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  ::
  vector<std::reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,unsigned_long>,std::pair<unsigned_long,unsigned_long>&,std::pair<unsigned_long,unsigned_long>*>>,void>
            ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
              *)&local_168,&local_58,&local_78,(allocator_type *)&local_b0);
  pvVar4 = *(void **)local_1a0;
  *(pointer *)local_1a0 =
       local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start;
  *(pointer *)(local_1a0 + 8) =
       local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  *(pointer *)(local_1a0 + 0x10) =
       local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c0 = in;
  if ((pvVar4 != (void *)0x0) &&
     (operator_delete(pvVar4),
     local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
     super__Vector_impl_data._M_start != (pointer)0x0)) {
    operator_delete(local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  pppVar23 = local_218._M_impl.super__Deque_impl_data._M_finish._M_node;
  pppVar22 = local_218._M_impl.super__Deque_impl_data._M_start._M_node;
  ppVar16 = local_218._M_impl.super__Deque_impl_data._M_start._M_first;
  ppVar15 = local_218._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_198 = local_218._M_impl.super__Deque_impl_data._M_start._M_last;
  uVar31 = ((long)local_218._M_impl.super__Deque_impl_data._M_start._M_last -
            (long)local_218._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
           ((long)local_218._M_impl.super__Deque_impl_data._M_finish._M_cur -
            (long)local_218._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
           ((((ulong)((long)local_218._M_impl.super__Deque_impl_data._M_finish._M_node -
                     (long)local_218._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
           (ulong)(local_218._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0))
           * 0x20;
  pppVar20 = local_218._M_impl.super__Deque_impl_data._M_start._M_node;
  pvVar36 = local_1c0;
  if (uVar31 == 0) {
    local_140 = uVar12;
    __assert_fail("n_left_mins >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/ansv.hpp"
                  ,0x60,
                  "void ansv(const std::vector<T> &, std::vector<size_t> &, std::vector<size_t> &, std::vector<std::pair<T, size_t>> &, const mxx::comm &, size_t) [T = unsigned long, left_type = 2, right_type = 2, indexing_type = 1]"
                 );
  }
  for (; local_1c0 = pvVar36, local_140 = uVar12, pppVar20 < pppVar23; pppVar20 = pppVar20 + 1) {
    operator_delete(pppVar20[1]);
    uVar12 = local_140;
    pvVar36 = local_1c0;
  }
  local_218._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar15;
  local_218._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar16;
  local_218._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar22;
  local_218._M_impl.super__Deque_impl_data._M_finish._M_last = local_198;
  if ((pvVar36->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (pvVar36->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    uVar40 = 0;
    ppVar17 = local_218._M_impl.super__Deque_impl_data._M_start._M_cur;
LAB_00142541:
    do {
      pppVar20 = local_218._M_impl.super__Deque_impl_data._M_finish._M_node;
      if (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur != ppVar17) {
        uVar28 = (pvVar36->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start[uVar40];
        ppVar15 = ppVar17;
        if (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar16) {
          if (uVar28 < local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].first) {
            operator_delete(ppVar16);
            ppVar16 = local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            local_218._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar16 + 0x20;
            local_218._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar16 + 0x1f;
            ppVar15 = local_218._M_impl.super__Deque_impl_data._M_start._M_cur;
            ppVar17 = local_218._M_impl.super__Deque_impl_data._M_start._M_cur;
            local_218._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar16;
            local_218._M_impl.super__Deque_impl_data._M_finish._M_node =
                 local_218._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
            goto LAB_00142541;
          }
        }
        else if (uVar28 < local_218._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].first) {
          local_218._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_218._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          goto LAB_00142541;
        }
      }
      while( true ) {
        uVar28 = (long)local_218._M_impl.super__Deque_impl_data._M_finish._M_cur - (long)ppVar16 >>
                 4;
        puVar37 = (pointer)(pvVar36->
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data._M_start[uVar40];
        if (((long)local_218._M_impl.super__Deque_impl_data._M_start._M_last - (long)ppVar15 >> 4) +
            uVar28 + ((((ulong)((long)pppVar20 -
                               (long)local_218._M_impl.super__Deque_impl_data._M_start._M_node) >> 3
                       ) - 1) + (ulong)(pppVar20 == (_Map_pointer)0x0)) * 0x20 < 2) break;
        ppVar19 = local_218._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar16) {
          ppVar19 = pppVar20[-1] + 0x20;
        }
        if (puVar37 != (pointer)ppVar19[-1].first) break;
        uVar26 = uVar28 - 1;
        if ((long)uVar28 < 1) {
          uVar28 = (long)uVar26 >> 5;
LAB_00142641:
          pppVar22 = pppVar20 + uVar28;
          ppVar14 = *pppVar22;
          ppVar17 = ppVar14 + uVar26 + uVar28 * -0x20;
        }
        else {
          if (0x20 < uVar28) {
            uVar28 = uVar26 >> 5;
            goto LAB_00142641;
          }
          ppVar17 = local_218._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
          pppVar22 = pppVar20;
          ppVar14 = ppVar16;
        }
        if (ppVar17 == ppVar14) {
          ppVar17 = pppVar22[-1] + 0x20;
        }
        if (puVar37 != (pointer)ppVar17[-1].first) break;
        if (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar16) {
          operator_delete(ppVar16);
          pppVar20 = local_218._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
          ppVar16 = local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
          local_218._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar16 + 0x20;
          local_218._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar16 + 0x1f;
          ppVar15 = local_218._M_impl.super__Deque_impl_data._M_start._M_cur;
          local_218._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar16;
          local_218._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar20;
        }
        else {
          local_218._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_218._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
        }
      }
      local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)(uVar40 + uVar12);
      local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = puVar37;
      if (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_218._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::_M_push_back_aux<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&local_218,(pair<unsigned_long,_unsigned_long> *)&local_168);
      }
      else {
        (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur)->first = (unsigned_long)puVar37;
        (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur)->second =
             (unsigned_long)
             local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_218._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_218._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      uVar40 = uVar40 + 1;
      ppVar15 = local_218._M_impl.super__Deque_impl_data._M_finish._M_cur;
      ppVar17 = local_218._M_impl.super__Deque_impl_data._M_start._M_cur;
      ppVar16 = local_218._M_impl.super__Deque_impl_data._M_finish._M_first;
    } while (uVar40 < (ulong)((long)(pvVar36->
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pvVar36->
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    )._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  ppVar11 = local_218._M_impl.super__Deque_impl_data._M_finish._M_first;
  ppVar10 = local_218._M_impl.super__Deque_impl_data._M_finish._M_cur;
  ppVar9 = local_218._M_impl.super__Deque_impl_data._M_start._M_last;
  ppVar15 = local_218._M_impl.super__Deque_impl_data._M_start._M_cur;
  uVar40 = (long)local_218._M_impl.super__Deque_impl_data._M_finish._M_node -
           (long)local_218._M_impl.super__Deque_impl_data._M_start._M_node;
  bVar43 = local_218._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0;
  local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       &(local_218._M_impl.super__Deque_impl_data._M_start._M_cur)->first;
  local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       &(local_218._M_impl.super__Deque_impl_data._M_start._M_first)->first;
  local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       &(local_218._M_impl.super__Deque_impl_data._M_start._M_last)->first;
  local_150 = local_218._M_impl.super__Deque_impl_data._M_start._M_node;
  local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       &(local_218._M_impl.super__Deque_impl_data._M_finish._M_cur)->first;
  local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       &(local_218._M_impl.super__Deque_impl_data._M_finish._M_first)->first;
  local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       &(local_218._M_impl.super__Deque_impl_data._M_finish._M_last)->first;
  local_98 = local_218._M_impl.super__Deque_impl_data._M_finish._M_node;
  std::
  vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  ::
  _M_range_insert<std::_Deque_iterator<std::pair<unsigned_long,unsigned_long>,std::pair<unsigned_long,unsigned_long>&,std::pair<unsigned_long,unsigned_long>*>>
            (local_1a0,*(undefined8 *)(local_1a0 + 8));
  pppVar23 = local_218._M_impl.super__Deque_impl_data._M_finish._M_node;
  pppVar22 = local_218._M_impl.super__Deque_impl_data._M_start._M_node;
  ppVar19 = local_218._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_120 = (local_218._M_impl.super__Deque_impl_data._M_start._M_cur)->first;
  lVar39 = ((long)ppVar9 - (long)ppVar15 >> 4) + ((long)ppVar10 - (long)ppVar11 >> 4) +
           (((uVar40 >> 3) - 1) + (ulong)bVar43) * 0x20;
  ppVar16 = local_218._M_impl.super__Deque_impl_data._M_start._M_first;
  ppStack_190 = local_218._M_impl.super__Deque_impl_data._M_start._M_last;
  pppVar20 = local_218._M_impl.super__Deque_impl_data._M_start._M_node;
  pcVar8 = local_188;
  if (lVar39 == 0) {
    __assert_fail("n_right_mins >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/ansv.hpp"
                  ,0x76,
                  "void ansv(const std::vector<T> &, std::vector<size_t> &, std::vector<size_t> &, std::vector<std::pair<T, size_t>> &, const mxx::comm &, size_t) [T = unsigned long, left_type = 2, right_type = 2, indexing_type = 1]"
                 );
  }
  for (; local_198 = ppVar16, local_188 = pcVar8, pppVar20 < pppVar23; pppVar20 = pppVar20 + 1) {
    operator_delete(pppVar20[1]);
    ppVar16 = local_198;
    pcVar8 = local_188;
  }
  local_218._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar19;
  local_218._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar22;
  local_218._M_impl.super__Deque_impl_data._M_finish._M_first = local_198;
  local_218._M_impl.super__Deque_impl_data._M_finish._M_last = ppStack_190;
  if (lVar39 + uVar31 != *(long *)(local_1a0 + 8) - *(long *)local_1a0 >> 4) {
    __assert_fail("n_right_mins + n_left_mins == lr_mins.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/ansv.hpp"
                  ,0x78,
                  "void ansv(const std::vector<T> &, std::vector<size_t> &, std::vector<size_t> &, std::vector<std::pair<T, size_t>> &, const mxx::comm &, size_t) [T = unsigned long, left_type = 2, right_type = 2, indexing_type = 1]"
                 );
  }
  mxx::allgather<unsigned_long>(&local_168,&local_120,1,pcVar8);
  local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_b0,(long)pcVar8->m_size,(value_type_conflict *)&local_c8,
             (allocator_type *)&local_f8);
  local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_c8,(long)pcVar8->m_size,(value_type_conflict *)&local_f8,
             (allocator_type *)&local_e0);
  comm_00 = local_188;
  iVar2 = pcVar8->m_rank;
  lVar39 = (long)iVar2;
  if (0 < lVar39) {
    uVar40 = *(ulong *)((long)local_168.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start + lVar39 * 8 + -8);
    local_198 = *(pair<unsigned_long,_unsigned_long> **)local_1a0;
    uVar12 = 0;
    lVar29 = lVar39;
    do {
      uVar32 = uVar12;
      if ((uVar12 != 0 && lVar29 < lVar39) &&
         (uVar32 = uVar12 - 1, uVar40 < local_198[uVar12 - 1].first)) {
        uVar32 = uVar12;
      }
      uVar28 = uVar12 + 1;
      if (uVar12 + 1 < uVar31) {
        uVar28 = uVar31;
      }
      lVar1 = lVar29 + -1;
      uVar26 = *(ulong *)((long)local_168.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start + lVar1 * 8);
      uVar27 = uVar12 - 1;
      puVar34 = (ulong *)(uVar12 * 0x10 + *(long *)local_1a0);
      do {
        uVar12 = uVar28 - 1;
        if ((1 - uVar28) + uVar27 == -1) break;
        uVar12 = uVar27 + 1;
        uVar41 = *puVar34;
        uVar27 = uVar12;
        puVar34 = puVar34 + 2;
      } while (uVar26 <= uVar41);
      if (uVar26 <= uVar40) {
        *(unsigned_long *)
         ((long)local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start + lVar1 * 8) = (uVar12 - uVar32) + 1;
        local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[lVar1] = uVar32;
        uVar40 = uVar26;
        if (*(ulong *)((long)local_168.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start + lVar1 * 8) < local_120)
        break;
      }
      bVar43 = 1 < lVar29;
      lVar29 = lVar1;
    } while (bVar43);
  }
  iVar3 = local_188->m_size;
  if (iVar2 < iVar3 + -1) {
    lVar29 = *(long *)local_1a0;
    uVar26 = *(long *)(local_1a0 + 8) - lVar29 >> 4;
    uVar40 = ((unsigned_long *)
             ((long)local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start + 8))[lVar39];
    local_198 = (pair<unsigned_long,_unsigned_long> *)
                local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
    lVar39 = lVar39 + 1;
    uVar28 = uVar26 - 1;
    iVar24 = iVar2;
    do {
      uVar41 = uVar28;
      if (iVar2 < iVar24) {
        uVar33 = uVar28 + 1;
        if (uVar28 + 1 < uVar26) {
          uVar33 = uVar26;
        }
        puVar34 = (ulong *)(uVar28 * 0x10 + lVar29 + 0x10);
        uVar30 = uVar28 - 1;
        do {
          uVar41 = uVar33 - 1;
          if (uVar26 <= uVar30 + 2) break;
          uVar41 = uVar30 + 1;
          uVar5 = *puVar34;
          puVar34 = puVar34 + 2;
          uVar30 = uVar41;
        } while (uVar5 <= uVar40);
      }
      uVar33 = local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[lVar39];
      uVar30 = uVar28;
      if (uVar31 < uVar28) {
        puVar34 = (ulong *)(uVar28 * 0x10 + lVar29);
        do {
          uVar30 = uVar28;
          if (*puVar34 < uVar33) break;
          uVar28 = uVar28 - 1;
          puVar34 = puVar34 + -2;
          uVar30 = uVar31;
        } while (uVar31 < uVar28);
      }
      if (uVar33 <= uVar40) {
        local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[lVar39] = (uVar41 - uVar30) + 1;
        local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[lVar39] = uVar30;
        uVar40 = uVar33;
        if (local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[lVar39] < local_120) break;
      }
      iVar24 = (int)lVar39;
      lVar39 = lVar39 + 1;
      uVar28 = uVar30;
    } while (iVar3 != (int)lVar39);
  }
  mxx::all2all<unsigned_long>(&local_f8,&local_b0,local_188);
  mxx::impl::get_displacements<unsigned_long>(&local_e0,&local_f8);
  pvVar36 = local_1c0;
  uVar12 = local_e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish[-1];
  uVar32 = local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish[-1];
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::vector(&local_118,uVar12 + uVar32,(allocator_type *)&local_138);
  mxx::all2allv<std::pair<unsigned_long,unsigned_long>>
            (*(pair<unsigned_long,_unsigned_long> **)local_1a0,&local_b0,&local_c8,
             local_118.
             super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start,&local_f8,&local_e0,comm_00);
  local_198 = (pair<unsigned_long,_unsigned_long> *)
              local_e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[comm_00->m_rank];
  local_128 = uVar12 + uVar32;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1b8,local_170);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(local_1c8,local_170);
  pppVar23 = local_218._M_impl.super__Deque_impl_data._M_finish._M_node;
  pppVar22 = local_218._M_impl.super__Deque_impl_data._M_start._M_node;
  ppVar15 = local_218._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_188 = (comm *)local_218._M_impl.super__Deque_impl_data._M_start._M_first;
  ppStack_180 = local_218._M_impl.super__Deque_impl_data._M_start._M_last;
  for (pppVar20 = local_218._M_impl.super__Deque_impl_data._M_start._M_node; pppVar20 < pppVar23;
      pppVar20 = pppVar20 + 1) {
    operator_delete(pppVar20[1]);
  }
  local_218._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar15;
  local_218._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar22;
  lVar39 = (long)(pvVar36->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(pvVar36->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start;
  local_218._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)local_188;
  local_218._M_impl.super__Deque_impl_data._M_finish._M_last = ppStack_180;
  if (lVar39 != 0) {
    uVar31 = lVar39 >> 3;
    do {
      uVar31 = uVar31 - 1;
      if (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_218._M_impl.super__Deque_impl_data._M_start._M_cur) {
        puVar37 = (pvVar36->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        ppVar16 = local_218._M_impl.super__Deque_impl_data._M_finish._M_first;
        do {
          uVar40 = puVar37[uVar31];
          if (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar16) {
            ppVar17 = local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            if (ppVar17[0x1f].first <= uVar40) break;
            (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1b8->first)->
            _M_impl).super__Vector_impl_data._M_start[ppVar17[0x1f].second] = uVar31;
            ppVar15 = ppVar17 + 0x20;
          }
          else {
            if (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].first <= uVar40)
            break;
            (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1b8->first)->
            _M_impl).super__Vector_impl_data._M_start
            [local_218._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].second] = uVar31;
            ppVar15 = local_218._M_impl.super__Deque_impl_data._M_finish._M_cur;
          }
          uVar12 = ppVar15[-1].first;
          uVar32 = ppVar15[-1].second;
          if (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur != ppVar16)
          goto LAB_00142cdd;
          while( true ) {
            operator_delete(ppVar16);
            ppVar16 = local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            local_218._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar16 + 0x20;
            local_218._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar16 + 0x1f;
            local_218._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar16;
            local_218._M_impl.super__Deque_impl_data._M_finish._M_node =
                 local_218._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
            while( true ) {
              if (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  local_218._M_impl.super__Deque_impl_data._M_start._M_cur) goto LAB_00142d16;
              if (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar16) break;
              if (uVar12 != local_218._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].first)
              goto LAB_00142d0d;
              (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1b8->first)->
              _M_impl).super__Vector_impl_data._M_start
              [local_218._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].second] = uVar32;
LAB_00142cdd:
              local_218._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_218._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
            }
            if (uVar12 != local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].first
               ) break;
            (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1b8->first)->
            _M_impl).super__Vector_impl_data._M_start
            [local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].second] = uVar32;
          }
LAB_00142d0d:
          if (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_218._M_impl.super__Deque_impl_data._M_start._M_cur) break;
        } while( true );
      }
LAB_00142d16:
      pvVar36 = local_1c0;
      local_138.first =
           (local_1c0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start[uVar31];
      local_138.second = uVar31;
      if (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_218._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::_M_push_back_aux<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&local_218,&local_138);
      }
      else {
        (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur)->first = local_138.first;
        (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur)->second = uVar31;
        local_218._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_218._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
    } while (uVar31 != 0);
  }
  ppVar16 = local_218._M_impl.super__Deque_impl_data._M_start._M_cur;
  ppVar17 = local_218._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (local_198 != (pair<unsigned_long,_unsigned_long> *)0x0) {
    local_90 = (long)local_198 - 1;
    local_88 = (long)local_198 * 0x10 + -0x10;
    uVar31 = 0;
    ppVar14 = local_218._M_impl.super__Deque_impl_data._M_finish._M_cur;
LAB_00142da5:
    if (ppVar14 != ppVar16) {
      lVar39 = ~uVar31 + (long)local_198;
      local_80 = lVar39 * 0x10;
      local_188 = (comm *)(local_118.
                           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar39);
      local_140 = local_170 + lVar39;
      ppVar13 = local_218._M_impl.super__Deque_impl_data._M_finish._M_first;
LAB_00142df6:
      if (ppVar14 == ppVar13) {
        ppVar21 = local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
        if (ppVar21[0x1f].first <= local_188->_vptr_comm) goto LAB_00142f5b;
        (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1b8->first)->_M_impl
        ).super__Vector_impl_data._M_start[ppVar21[0x1f].second] = local_140;
        uVar12 = ppVar21[0x1f].first;
        uVar32 = ppVar21[0x1f].second;
        operator_delete(ppVar13);
        ppVar13 = local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
        local_218._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar13 + 0x20;
        ppVar14 = ppVar13 + 0x1f;
        ppVar16 = local_218._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_218._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar13;
        local_218._M_impl.super__Deque_impl_data._M_finish._M_node =
             local_218._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
      }
      else {
        if (ppVar14[-1].first <= local_188->_vptr_comm) goto LAB_00142f5b;
        (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1b8->first)->_M_impl
        ).super__Vector_impl_data._M_start[ppVar14[-1].second] = local_140;
        uVar12 = ppVar14[-1].first;
        uVar32 = ppVar14[-1].second;
        ppVar14 = ppVar14 + -1;
      }
      ppVar17 = ppVar14;
      local_218._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar14;
      if (ppVar14 != ppVar16) {
        do {
          local_218._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar14;
          if (ppVar14 == ppVar13) {
            if (uVar12 != local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].first
               ) goto LAB_00142f4a;
            (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1b8->first)->
            _M_impl).super__Vector_impl_data._M_start
            [local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].second] = uVar32;
            operator_delete(ppVar13);
            ppVar13 = local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            local_218._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar13 + 0x20;
            ppVar14 = ppVar13 + 0x1f;
            ppVar16 = local_218._M_impl.super__Deque_impl_data._M_start._M_cur;
            local_218._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar13;
            local_218._M_impl.super__Deque_impl_data._M_finish._M_node =
                 local_218._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
          }
          else {
            if (uVar12 != ppVar14[-1].first) goto LAB_00142f4a;
            (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1b8->first)->
            _M_impl).super__Vector_impl_data._M_start[ppVar14[-1].second] = uVar32;
            ppVar14 = ppVar14 + -1;
          }
          ppVar17 = ppVar14;
          local_218._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar14;
          if (ppVar14 == ppVar16) break;
        } while( true );
      }
      goto LAB_00142f5b;
    }
  }
LAB_001430b7:
  pppVar20 = local_218._M_impl.super__Deque_impl_data._M_start._M_node;
  local_188 = (comm *)local_218._M_impl.super__Deque_impl_data._M_finish._M_node;
  if (ppVar17 != ppVar16) {
    puVar37 = (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1b8->first)->
              _M_impl).super__Vector_impl_data._M_start;
    pppVar22 = local_218._M_impl.super__Deque_impl_data._M_finish._M_node;
    ppVar15 = local_218._M_impl.super__Deque_impl_data._M_finish._M_first;
LAB_001430f0:
    puVar6 = (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1b8->first)->
             _M_impl).super__Vector_impl_data._M_start;
    pppVar23 = pppVar22;
    ppVar13 = ppVar15;
    ppVar14 = ppVar17;
    do {
      uVar26 = (long)ppVar14 - (long)ppVar13 >> 4;
      uVar31 = uVar26 - 1;
      uVar28 = (long)uVar31 >> 5;
      uVar40 = uVar28;
      if ((long)uVar26 < 1) {
LAB_00143127:
        ppVar21 = pppVar23[uVar40] + uVar31 + uVar40 * -0x20;
      }
      else {
        if (0x20 < uVar26) {
          uVar40 = uVar31 >> 5;
          goto LAB_00143127;
        }
        ppVar21 = ppVar14 + -1;
      }
      if (ppVar21 == ppVar16) goto LAB_001431ef;
      ppVar21 = ppVar17;
      if (ppVar17 == ppVar15) {
        ppVar21 = pppVar22[-1] + 0x20;
      }
      if ((long)uVar26 < 1) {
LAB_0014317b:
        pppVar35 = pppVar23 + uVar28;
        ppVar25 = *pppVar35;
        ppVar38 = ppVar25 + uVar31 + uVar28 * -0x20;
      }
      else {
        if (0x20 < uVar26) {
          uVar28 = uVar31 >> 5;
          goto LAB_0014317b;
        }
        ppVar38 = ppVar14 + -1;
        ppVar25 = ppVar13;
        pppVar35 = pppVar23;
      }
      if (ppVar38 == ppVar25) {
        ppVar38 = pppVar35[-1] + 0x20;
      }
      if (ppVar21[-1].first != ppVar38[-1].first) goto LAB_001431ef;
      if (ppVar14 == ppVar13) {
        ppVar13 = pppVar23[-1];
        pppVar23 = pppVar23 + -1;
        ppVar14 = ppVar13 + 0x20;
      }
      ppVar21 = ppVar17;
      if (ppVar17 == ppVar15) {
        ppVar21 = pppVar22[-1] + 0x20;
      }
      ppVar14 = ppVar14 + -1;
      ppVar38 = ppVar14;
      if (ppVar14 == ppVar13) {
        ppVar38 = pppVar23[-1] + 0x20;
      }
      puVar6[ppVar38[-1].second] = ppVar21[-1].second;
    } while( true );
  }
LAB_0014323a:
  local_1b8 = local_218._M_impl.super__Deque_impl_data._M_start._M_first;
  ppStack_1b0 = local_218._M_impl.super__Deque_impl_data._M_start._M_last;
  pppVar22 = local_218._M_impl.super__Deque_impl_data._M_start._M_node;
  if (local_218._M_impl.super__Deque_impl_data._M_start._M_node <
      local_218._M_impl.super__Deque_impl_data._M_finish._M_node) {
    do {
      pppVar23 = pppVar22 + 1;
      operator_delete(pppVar22[1]);
      pppVar22 = pppVar23;
    } while (pppVar23 < local_188);
  }
  local_218._M_impl.super__Deque_impl_data._M_finish._M_first = local_1b8;
  local_218._M_impl.super__Deque_impl_data._M_finish._M_last = ppStack_1b0;
  local_218._M_impl.super__Deque_impl_data._M_finish._M_node = pppVar20;
  puVar37 = (pvVar36->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_218._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar16;
  if ((pvVar36->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar37) {
    uVar31 = 0;
    do {
      ppVar15 = local_218._M_impl.super__Deque_impl_data._M_start._M_cur;
      ppVar16 = local_218._M_impl.super__Deque_impl_data._M_finish._M_first;
      if (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          local_218._M_impl.super__Deque_impl_data._M_start._M_cur) {
        do {
          if (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar16) {
            ppVar17 = local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            if (ppVar17[0x1f].first <= puVar37[uVar31]) break;
            (local_1c8->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start[ppVar17[0x1f].second] = uVar31;
            ppVar19 = ppVar17 + 0x20;
          }
          else {
            if (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].first <=
                puVar37[uVar31]) break;
            (local_1c8->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start
            [local_218._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].second] = uVar31;
            ppVar19 = local_218._M_impl.super__Deque_impl_data._M_finish._M_cur;
          }
          uVar12 = ppVar19[-1].first;
          uVar32 = ppVar19[-1].second;
          if (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur != ppVar16)
          goto LAB_0014337f;
          while( true ) {
            operator_delete(ppVar16);
            ppVar16 = local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            local_218._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar16 + 0x20;
            local_218._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar16 + 0x1f;
            ppVar15 = local_218._M_impl.super__Deque_impl_data._M_start._M_cur;
            local_218._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar16;
            local_218._M_impl.super__Deque_impl_data._M_finish._M_node =
                 local_218._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
            while( true ) {
              if (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar15)
              goto LAB_001433b8;
              if (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar16) break;
              if (uVar12 != local_218._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].first)
              goto LAB_001433af;
              (local_1c8->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
              .super__Vector_impl_data._M_start
              [local_218._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].second] = uVar32;
LAB_0014337f:
              local_218._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_218._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
            }
            if (uVar12 != local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].first
               ) break;
            (local_1c8->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start
            [local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].second] = uVar32;
          }
LAB_001433af:
          if (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur == ppVar15) break;
        } while( true );
      }
LAB_001433b8:
      pvVar36 = local_1c0;
      local_138.first =
           (local_1c0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start[uVar31];
      local_138.second = uVar31;
      if (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_218._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::_M_push_back_aux<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&local_218,&local_138);
      }
      else {
        (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur)->first = local_138.first;
        (local_218._M_impl.super__Deque_impl_data._M_finish._M_cur)->second = uVar31;
        local_218._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_218._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      uVar31 = uVar31 + 1;
      puVar37 = (pvVar36->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                .super__Vector_impl_data._M_start;
    } while (uVar31 < (ulong)((long)(pvVar36->
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)puVar37 >> 3
                             ));
  }
  ppVar16 = local_218._M_impl.super__Deque_impl_data._M_start._M_cur;
  ppVar17 = local_218._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if ((pair<unsigned_long,_unsigned_long> *)local_128 != local_198) {
    local_188 = (comm *)(local_128 - (long)local_198);
    local_128 = local_128 - 1;
    pppVar20 = (_Map_pointer)0x0;
    ppVar14 = local_218._M_impl.super__Deque_impl_data._M_finish._M_cur;
    ppVar13 = local_198;
LAB_0014345e:
    if (ppVar14 != ppVar16) {
      sVar42 = (long)ppVar13 + (long)pppVar20;
      local_1c0 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(sVar42 * 0x10);
      local_1b8 = local_118.
                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + sVar42;
      uVar12 = local_170 + sVar42;
      ppVar13 = local_218._M_impl.super__Deque_impl_data._M_finish._M_first;
LAB_00143497:
      if (ppVar14 == ppVar13) {
        ppVar21 = local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
        if (ppVar21[0x1f].first <= local_1b8->first) goto LAB_001435e9;
        (local_1c8->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_start[ppVar21[0x1f].second] = uVar12;
        uVar32 = ppVar21[0x1f].first;
        uVar27 = ppVar21[0x1f].second;
        operator_delete(ppVar13);
        ppVar13 = local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
        local_218._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar13 + 0x20;
        ppVar14 = ppVar13 + 0x1f;
        ppVar16 = local_218._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_218._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar13;
        local_218._M_impl.super__Deque_impl_data._M_finish._M_node =
             local_218._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
      }
      else {
        if (ppVar14[-1].first <= local_1b8->first) goto LAB_001435e9;
        (local_1c8->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_start[ppVar14[-1].second] = uVar12;
        uVar32 = ppVar14[-1].first;
        uVar27 = ppVar14[-1].second;
        ppVar14 = ppVar14 + -1;
      }
      ppVar17 = ppVar14;
      local_218._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar14;
      if (ppVar14 != ppVar16) {
        do {
          local_218._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar14;
          if (ppVar14 == ppVar13) {
            if (uVar32 != local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].first
               ) goto LAB_001435d8;
            (local_1c8->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start
            [local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].second] = uVar27;
            operator_delete(ppVar13);
            ppVar13 = local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            local_218._M_impl.super__Deque_impl_data._M_finish._M_last = ppVar13 + 0x20;
            ppVar14 = ppVar13 + 0x1f;
            ppVar16 = local_218._M_impl.super__Deque_impl_data._M_start._M_cur;
            local_218._M_impl.super__Deque_impl_data._M_finish._M_first = ppVar13;
            local_218._M_impl.super__Deque_impl_data._M_finish._M_node =
                 local_218._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
          }
          else {
            if (uVar32 != ppVar14[-1].first) goto LAB_001435d8;
            (local_1c8->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start[ppVar14[-1].second] = uVar27;
            ppVar14 = ppVar14 + -1;
          }
          ppVar17 = ppVar14;
          local_218._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar14;
          if (ppVar14 == ppVar16) break;
        } while( true );
      }
      goto LAB_001435e9;
    }
  }
LAB_00143785:
  if (ppVar17 == ppVar16) {
LAB_001438f4:
    std::
    vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::operator=((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 *)local_1a0,&local_118);
    if (local_118.
        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pair<unsigned_long,_unsigned_long> *)0x0) {
      operator_delete(local_118.
                      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if ((pair<unsigned_long,_unsigned_long> *)
        local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pair<unsigned_long,_unsigned_long> *)0x0) {
      operator_delete(local_b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if ((pair<unsigned_long,_unsigned_long> *)
        local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pair<unsigned_long,_unsigned_long> *)0x0) {
      operator_delete(local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    std::
    _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::~_Deque_base(&local_218);
    return;
  }
  puVar37 = (local_1c8->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pppVar20 = local_218._M_impl.super__Deque_impl_data._M_finish._M_node;
  ppVar15 = local_218._M_impl.super__Deque_impl_data._M_finish._M_first;
LAB_001437ae:
  puVar6 = (local_1c8->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pppVar22 = pppVar20;
  ppVar13 = ppVar15;
  ppVar14 = ppVar17;
  do {
    uVar26 = (long)ppVar14 - (long)ppVar13 >> 4;
    uVar31 = uVar26 - 1;
    uVar28 = (long)uVar31 >> 5;
    uVar40 = uVar28;
    if ((long)uVar26 < 1) {
LAB_001437e6:
      ppVar21 = pppVar22[uVar40] + uVar31 + uVar40 * -0x20;
    }
    else {
      if (0x20 < uVar26) {
        uVar40 = uVar31 >> 5;
        goto LAB_001437e6;
      }
      ppVar21 = ppVar14 + -1;
    }
    if (ppVar21 == ppVar16) goto LAB_001438ae;
    ppVar21 = ppVar17;
    if (ppVar17 == ppVar15) {
      ppVar21 = pppVar20[-1] + 0x20;
    }
    if ((long)uVar26 < 1) {
LAB_0014383a:
      pppVar23 = pppVar22 + uVar28;
      ppVar25 = *pppVar23;
      ppVar38 = ppVar25 + uVar31 + uVar28 * -0x20;
    }
    else {
      if (0x20 < uVar26) {
        uVar28 = uVar31 >> 5;
        goto LAB_0014383a;
      }
      ppVar38 = ppVar14 + -1;
      pppVar23 = pppVar22;
      ppVar25 = ppVar13;
    }
    if (ppVar38 == ppVar25) {
      ppVar38 = pppVar23[-1] + 0x20;
    }
    if (ppVar21[-1].first != ppVar38[-1].first) goto LAB_001438ae;
    if (ppVar14 == ppVar13) {
      ppVar13 = pppVar22[-1];
      pppVar22 = pppVar22 + -1;
      ppVar14 = ppVar13 + 0x20;
    }
    ppVar21 = ppVar17;
    if (ppVar17 == ppVar15) {
      ppVar21 = pppVar20[-1] + 0x20;
    }
    ppVar14 = ppVar14 + -1;
    ppVar38 = ppVar14;
    if (ppVar14 == ppVar13) {
      ppVar38 = pppVar22[-1] + 0x20;
    }
    puVar6[ppVar38[-1].second] = ppVar21[-1].second;
  } while( true );
LAB_00142f4a:
  ppVar17 = ppVar14;
  if (ppVar14 == ppVar16) goto LAB_00142f5b;
  goto LAB_00142df6;
LAB_00142f5b:
  pvVar36 = local_1c0;
  uVar40 = uVar31;
  if (ppVar14 != ppVar16) {
    ppVar13 = ppVar14;
    if (ppVar14 == local_218._M_impl.super__Deque_impl_data._M_finish._M_first) {
      ppVar13 = local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
    }
    if (*(unsigned_long *)
         ((long)&(local_118.
                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->first + local_80) == ppVar13[-1].first
       ) {
      ppVar14 = ppVar17;
      if (lVar39 != 0) {
        plVar18 = (long *)((long)&local_118.
                                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[-uVar31].first +
                          local_88);
        do {
          uVar40 = uVar31;
          if (*plVar18 != plVar18[-2]) goto LAB_00142fd8;
          uVar31 = uVar31 + 1;
          plVar18 = plVar18 + -2;
          lVar39 = lVar39 + -1;
          uVar40 = local_90;
        } while (lVar39 != 0);
      }
      lVar39 = 0;
LAB_00142fd8:
      ppVar17 = ppVar14;
      if (ppVar14 != ppVar16) {
        ppVar13 = ppVar14;
        if (ppVar14 == local_218._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar13 = local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
        }
        if (ppVar13[-1].first !=
            local_118.
            super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar39].first) goto LAB_001430a6;
        if (ppVar14 == local_218._M_impl.super__Deque_impl_data._M_finish._M_first) {
          (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1b8->first)->
          _M_impl).super__Vector_impl_data._M_start
          [local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].second] =
               local_170 + lVar39;
          operator_delete(local_218._M_impl.super__Deque_impl_data._M_finish._M_first);
          local_218._M_impl.super__Deque_impl_data._M_finish._M_first =
               local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
          local_218._M_impl.super__Deque_impl_data._M_finish._M_last =
               local_218._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
          ppVar14 = local_218._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
          ppVar16 = local_218._M_impl.super__Deque_impl_data._M_start._M_cur;
          local_218._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar14;
          local_218._M_impl.super__Deque_impl_data._M_finish._M_node =
               local_218._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
        }
        else {
          (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1b8->first)->
          _M_impl).super__Vector_impl_data._M_start[ppVar14[-1].second] = local_170 + lVar39;
          ppVar14 = ppVar14 + -1;
          local_218._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar14;
        }
        goto LAB_00142fd8;
      }
    }
  }
LAB_001430a6:
  uVar31 = uVar40 + 1;
  if (local_198 <= uVar31) goto LAB_001430b7;
  goto LAB_00142da5;
LAB_001431ef:
  if (ppVar17 == ppVar15) {
    ppVar17 = pppVar22[-1] + 0x20;
  }
  puVar37[ppVar17[-1].second] = local_100;
  if (ppVar14 == ppVar13) {
    ppVar13 = pppVar23[-1];
    pppVar23 = pppVar23 + -1;
    ppVar14 = ppVar13 + 0x20;
  }
  ppVar17 = ppVar14 + -1;
  pppVar22 = pppVar23;
  ppVar15 = ppVar13;
  pvVar36 = local_1c0;
  if (ppVar17 == ppVar16) goto LAB_0014323a;
  goto LAB_001430f0;
LAB_001435d8:
  ppVar17 = ppVar14;
  if (ppVar14 == ppVar16) goto LAB_001435e9;
  goto LAB_00143497;
LAB_001435e9:
  pcVar8 = local_188;
  ppVar13 = local_198;
  if (ppVar14 != ppVar16) {
    ppVar21 = ppVar14;
    if (ppVar14 == local_218._M_impl.super__Deque_impl_data._M_finish._M_first) {
      ppVar21 = local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
    }
    if (*(unsigned_long *)
         ((long)&(local_1c0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start +
         (long)&(local_118.
                 super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->first) == ppVar21[-1].first) {
      ppVar14 = ppVar17;
      if (((_Map_pointer)((long)pppVar20 + 1U) < local_188) &&
         (*(long *)((long)&(local_1c0->
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data._M_start +
                   (long)&(local_118.
                           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->first) ==
          *(long *)((long)&(local_1c0->
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data._M_start +
                   (long)&local_118.
                          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[1].first))) {
        ppVar17 = local_118.
                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + (long)pppVar20 + (long)local_198 + 2U;
        do {
          pppVar22 = pppVar20;
          sVar42 = local_128;
          if (local_188 <= (_Map_pointer)((long)pppVar22 + 2U)) goto LAB_001436ac;
          ppVar21 = ppVar17 + -1;
          puVar7 = &ppVar17->first;
          ppVar17 = ppVar17 + 1;
          pppVar20 = (_Map_pointer)((long)pppVar22 + 1);
        } while (ppVar21->first == *puVar7);
        sVar42 = (long)pppVar22 + 1 + (long)local_198;
LAB_001436ac:
        pppVar20 = (_Map_pointer)((long)pppVar22 + 1);
      }
      while (ppVar17 = ppVar14, ppVar14 != ppVar16) {
        ppVar21 = ppVar14;
        if (ppVar14 == local_218._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar21 = local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
        }
        if (ppVar21[-1].first !=
            local_118.
            super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_start[sVar42].first) break;
        if (ppVar14 == local_218._M_impl.super__Deque_impl_data._M_finish._M_first) {
          (local_1c8->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start
          [local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].second] =
               local_170 + sVar42;
          operator_delete(local_218._M_impl.super__Deque_impl_data._M_finish._M_first);
          local_218._M_impl.super__Deque_impl_data._M_finish._M_first =
               local_218._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
          local_218._M_impl.super__Deque_impl_data._M_finish._M_last =
               local_218._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
          ppVar14 = local_218._M_impl.super__Deque_impl_data._M_finish._M_first + 0x1f;
          ppVar16 = local_218._M_impl.super__Deque_impl_data._M_start._M_cur;
          local_218._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar14;
          local_218._M_impl.super__Deque_impl_data._M_finish._M_node =
               local_218._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
        }
        else {
          (local_1c8->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start[ppVar14[-1].second] = local_170 + sVar42;
          ppVar14 = ppVar14 + -1;
          local_218._M_impl.super__Deque_impl_data._M_finish._M_cur = ppVar14;
        }
      }
    }
  }
  pppVar20 = (_Map_pointer)((long)pppVar20 + 1);
  if (pcVar8 <= pppVar20) goto LAB_00143785;
  goto LAB_0014345e;
LAB_001438ae:
  if (ppVar17 == ppVar15) {
    ppVar17 = pppVar20[-1] + 0x20;
  }
  puVar37[ppVar17[-1].second] = local_100;
  if (ppVar14 == ppVar13) {
    ppVar13 = pppVar22[-1];
    pppVar22 = pppVar22 + -1;
    ppVar14 = ppVar13 + 0x20;
  }
  ppVar17 = ppVar14 + -1;
  pppVar20 = pppVar22;
  ppVar15 = ppVar13;
  if (ppVar17 == ppVar16) goto LAB_001438f4;
  goto LAB_001437ae;
}

Assistant:

void ansv(const std::vector<T>& in, std::vector<size_t>& left_nsv, std::vector<size_t>& right_nsv, std::vector<std::pair<T,size_t> >& lr_mins, const mxx::comm& comm, size_t nonsv = 0) {
    std::deque<std::pair<T,size_t> > q;
    size_t local_size = in.size();
    size_t prefix = mxx::exscan(local_size, comm);

    /*****************************************************************
     *  Step 1: Locally calculate ANSV and save un-matched elements  *
     *****************************************************************/

    // backwards direction (left mins)
    for (size_t i = in.size(); i > 0; --i) {
        while (!q.empty() && in[i-1] < q.back().first)
            q.pop_back();
        if (right_type == furthest_eq) {
            // remove all equal elements but the last
            while (q.size() >= 2 && in[i-1] == q.back().first && in[i-1] == (q.rbegin()+1)->first) {
                q.pop_back();
            }
        } else {
            while (!q.empty() && in[i-1] == q.back().first)
                q.pop_back();
        }
        q.push_back(std::pair<T, size_t>(in[i-1], prefix+i-1));
    }
    // add results to left_mins
    lr_mins = std::vector<std::pair<T,size_t>>(q.rbegin(), q.rend());
    size_t n_left_mins = q.size();
    assert(n_left_mins >= 1);
    q.clear();

    // forward direction (right mins)
    for (size_t i = 0; i < in.size(); ++i) {
        while (!q.empty() && in[i] < q.back().first)
            q.pop_back();
        if (left_type == furthest_eq) {
            while (q.size() >= 2 && in[i] == q.back().first && in[i] == (q.rbegin()+1)->first) {
                // remove all but the last one that is equal, TODO: can be `if` instead
                q.pop_back();
            }
        } else {
            while (!q.empty() && in[i] == q.back().first)
                q.pop_back();
        }
        q.push_back(std::pair<T, size_t>(in[i], prefix+i));
    }
    // add results to right_mins
    size_t n_right_mins = q.size();
    lr_mins.insert(lr_mins.end(), q.begin(), q.end());
    T local_min = q.front().first;
    assert(n_right_mins >= 1);
    q.clear();
    assert(n_right_mins + n_left_mins == lr_mins.size());

    /***************************************************************
     *  Step 2: communicate un-matched elements to correct target  *
     ***************************************************************/

    // allgather min and max of all left and right mins
    //assert(local_min == lr_mins.front().first);
    std::vector<T> allmins = mxx::allgather(local_min, comm);
    std::vector<size_t> send_counts(comm.size(), 0);
    std::vector<size_t> send_displs(comm.size(), 0);

    // calculate which processor to exchange unmatched left_mins and right_mins with
    // 1) calculate communication parameters for left processes
    if (comm.rank() > 0) {
        size_t left_idx = 0;
        T prev_mins_min = allmins[comm.rank()-1];
        for (int i = comm.rank()-1; i >= 0; --i) {
            size_t start_idx = left_idx;
            // move start back to other `equal` elements (there can be at most 2)
            if (right_type == furthest_eq && i < comm.rank()-1) {
                if (start_idx > 0 && lr_mins[start_idx-1].first <= prev_mins_min) {
                    --start_idx;
                }
            }
            while (left_idx+1 < n_left_mins && lr_mins[left_idx].first >= allmins[i]) {
                ++left_idx;
            }
            // don't send anything if min is dominated by previous
            if (allmins[i] > prev_mins_min) {
                continue;
            } else {
                prev_mins_min = allmins[i];
            }

            // send all from [left_idx, start_idx] (inclusive) to proc `i`
            send_counts[i] = left_idx - start_idx + 1;
            send_displs[i] = start_idx;

            // set comm parameters
            if (allmins[i] < local_min) {
                break;
            }
        }
    }

    // 2) calculate communication parameters for right process
    if (comm.rank() < comm.size()-1) {
        size_t right_idx = lr_mins.size()-1; // n_left_mins;
        T prev_mins_min = allmins[comm.rank()+1];
        for (int i = comm.rank()+1; i < comm.size(); ++i) {
            // find the range which should be send
            size_t end_idx = right_idx;
            if (left_type == furthest_eq && i > comm.rank()+1) {
                // move start back to other `equal` elements
                while (end_idx+1 < lr_mins.size() && lr_mins[end_idx+1].first <= prev_mins_min) {
                    ++end_idx;
                }
            }
            while (right_idx > n_left_mins && lr_mins[right_idx].first >= allmins[i]) {
                --right_idx;
            }

            // don't send if the minimum of `i` is dominated by a prev min right of me
            if (prev_mins_min < allmins[i]) {
                continue;
            } else {
                prev_mins_min = allmins[i];
            }

            // now right_idx is the first one that is smaller than the min of `i`
            // send all elements from [start_idx, right_idx]
            send_counts[i] = end_idx - right_idx + 1;
            send_displs[i] = right_idx;

            // can stop if an overall smaller min than my own has been found
            if (allmins[i] < local_min) {
                break;
            }
        }
    }

    // exchange lr_mins via all2all
    std::vector<size_t> recv_counts = mxx::all2all(send_counts, comm);
    std::vector<size_t> recv_displs = mxx::impl::get_displacements(recv_counts);
    size_t recv_size = recv_counts.back() + recv_displs.back();
    std::vector<std::pair<T, size_t>> recved(recv_size);
    mxx::all2allv(&lr_mins[0], send_counts, send_displs, &recved[0], recv_counts, recv_displs, comm);

    // solve locally given the exchanged values (by prefilling min-queue before running locally)
    size_t n_left_recv = recv_displs[comm.rank()];
    size_t n_right_recv = recv_size - n_left_recv;


    /***************************************************************
     *  Step 3: Again solve ANSV locally and use lr_mins as tails  *
     ***************************************************************/

    left_nsv.resize(local_size);
    right_nsv.resize(local_size);

    q.clear();
    // iterate backwards to get the nearest smaller element to left for each element
    // TODO: this doesn't really require pairs in the queue (index suffices)
    for (size_t i = in.size(); i > 0; --i) {
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,left_type>(left_nsv, q, in[i-1], prefix+i-1, prefix);
            q.push_back(std::pair<T, size_t>(in[i-1], prefix+i-1));
        } else { // indexing_type == local_indexing
            // prefix=0 for local indexing
            update_nsv_queue<T,left_type>(left_nsv, q, in[i-1], i-1, 0);
            q.push_back(std::pair<T, size_t>(in[i-1], i-1));
        }
    }

    // now go backwards through the right-mins from the previous processors,
    // in order to resolve all local elements
    for (size_t i = 0; i < n_left_recv; ++i) {
        if (q.empty()) {
            break;
        }
        size_t rcv_idx = n_left_recv - i - 1;

        // set nsv for all larger elements in the queue
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,left_type>(left_nsv, q, recved[rcv_idx].first, recved[rcv_idx].second, prefix);
        } else { // indexing_type == local_indexing
            // prefix = 0, recv.2nd = local_size+rcv_idx,
            update_nsv_queue<T,left_type>(left_nsv, q, recved[rcv_idx].first, local_size + rcv_idx, 0);
        }

        if (left_type == furthest_eq) {
            if (!q.empty() && recved[rcv_idx].first == q.back().first) {
                // skip till furthest of an equal range
                while (rcv_idx != 0 && recved[rcv_idx].first == recved[rcv_idx-1].first) {
                    i++;
                    rcv_idx = n_left_recv - i - 1;
                }
                // setting this as the furthest_eq for all equal elements in the queue
                // and removing all equal elements from the queue
                while (!q.empty() && q.back().first == recved[rcv_idx].first) {
                    if (indexing_type == global_indexing) {
                        left_nsv[q.back().second - prefix] = recved[rcv_idx].second;
                    } else { // indexing_type == local_indexing
                        left_nsv[q.back().second] = local_size + rcv_idx;
                    }
                    q.pop_back();
                }
            }
        }
    }

    // elements still in the queue do not have a smaller value to the left
    //  -> set these to a special value and handle case if furthest_eq
    //     elements are still waiting in queue
    const size_t iprefix = (indexing_type == global_indexing) ? prefix : 0;
    for (auto it = q.rbegin(); it != q.rend(); ++it) {
        if (left_type == furthest_eq) {
                auto it2 = it;
                // set left most as furthest_eq for all equal elements
                while(it2+1 != q.rend() && it->first == (it2+1)->first) {
                    ++it2;
                    left_nsv[it2->second - iprefix] = it->second;
                }
                left_nsv[it->second - iprefix] = nonsv;
                it = it2;
        } else {
            left_nsv[it->second - iprefix] = nonsv;
        }
    }

    // iterate forwards to get the nearest smaller value to the right for each element
    q.clear();
    for (size_t i = 0; i < in.size(); ++i) {
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,right_type>(right_nsv, q, in[i], prefix+i, prefix);
            q.push_back(std::pair<T, size_t>(in[i], prefix+i));
        } else { // indexing_type == local_indexing
            // handle as if prefix = 0
            update_nsv_queue<T,right_type>(right_nsv, q, in[i], i, 0);
            q.push_back(std::pair<T, size_t>(in[i], i));
        }
    }

    // now go forwards through left-mins of succeeding processors
    for (size_t i = 0; i < n_right_recv; ++i) {
        size_t rcv_idx = n_left_recv + i;
        if (q.empty()) {
            break;
        }
        // set nsv for all larger elements in the queue
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,right_type>(right_nsv, q, recved[rcv_idx].first, recved[rcv_idx].second, prefix);
        } else { // indexing_type == local_indexing
            update_nsv_queue<T,right_type>(right_nsv, q, recved[rcv_idx].first, local_size+rcv_idx, 0);
        }

        if (right_type == furthest_eq) {
            if (!q.empty() && recved[rcv_idx].first == q.back().first) {
                // skip till furthest of an equal range
                while (i+1 < n_right_recv  && recved[rcv_idx].first == recved[rcv_idx+1].first) {
                    i++;
                    rcv_idx = n_left_recv + i;
                }
                // setting this as the furthest_eq for all equal elements in the queue
                // and removing all equal elements from the queue
                while (!q.empty() && q.back().first == recved[rcv_idx].first) {
                    if (indexing_type == global_indexing) {
                        right_nsv[q.back().second - prefix] = recved[rcv_idx].second;
                    } else { // indexing_type == local_indexing
                        right_nsv[q.back().second] = local_size+rcv_idx;
                    }
                    q.pop_back();
                }
            }
        }
    }

    // elements still in the queue do not have a smaller value to the left
    // -> set these to a special value and handle case if furthest_eq elements
    // are still waiting in queue
    for (auto it = q.rbegin(); it != q.rend(); ++it) {
        if (right_type == furthest_eq) {
                auto it2 = it;
                // set left most as furthest_eq for all equal elements
                while(it2+1 != q.rend() && it->first == (it2+1)->first) {
                    ++it2;
                    right_nsv[it2->second - iprefix] = it->second;
                }
                right_nsv[it->second - iprefix] = nonsv;
                it = it2;
        } else {
            right_nsv[it->second - iprefix] = nonsv;
        }
    }

    lr_mins = recved;
}